

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

void point_mul(u8 *d,u8 *a,u8 *b)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  
  d[0x2c] = '\0';
  d[0x2d] = '\0';
  d[0x2e] = '\0';
  d[0x2f] = '\0';
  d[0x30] = '\0';
  d[0x31] = '\0';
  d[0x32] = '\0';
  d[0x33] = '\0';
  d[0x34] = '\0';
  d[0x35] = '\0';
  d[0x36] = '\0';
  d[0x37] = '\0';
  d[0x38] = '\0';
  d[0x39] = '\0';
  d[0x3a] = '\0';
  d[0x3b] = '\0';
  d[0x20] = '\0';
  d[0x21] = '\0';
  d[0x22] = '\0';
  d[0x23] = '\0';
  d[0x24] = '\0';
  d[0x25] = '\0';
  d[0x26] = '\0';
  d[0x27] = '\0';
  d[0x28] = '\0';
  d[0x29] = '\0';
  d[0x2a] = '\0';
  d[0x2b] = '\0';
  d[0x2c] = '\0';
  d[0x2d] = '\0';
  d[0x2e] = '\0';
  d[0x2f] = '\0';
  d[0x10] = '\0';
  d[0x11] = '\0';
  d[0x12] = '\0';
  d[0x13] = '\0';
  d[0x14] = '\0';
  d[0x15] = '\0';
  d[0x16] = '\0';
  d[0x17] = '\0';
  d[0x18] = '\0';
  d[0x19] = '\0';
  d[0x1a] = '\0';
  d[0x1b] = '\0';
  d[0x1c] = '\0';
  d[0x1d] = '\0';
  d[0x1e] = '\0';
  d[0x1f] = '\0';
  d[0] = '\0';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  d[4] = '\0';
  d[5] = '\0';
  d[6] = '\0';
  d[7] = '\0';
  d[8] = '\0';
  d[9] = '\0';
  d[10] = '\0';
  d[0xb] = '\0';
  d[0xc] = '\0';
  d[0xd] = '\0';
  d[0xe] = '\0';
  d[0xf] = '\0';
  lVar3 = 0;
  do {
    uVar2 = 0x80;
    do {
      point_double(d,d);
      if ((uVar2 & a[lVar3]) != 0) {
        point_add(d,d,b);
      }
      bVar1 = 1 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1e);
  return;
}

Assistant:

static void point_mul(u8 *d, u8 *a, u8 *b)	// a is bignum
{
	u32 i;
	u8 mask;

	elt_zero(d);
	elt_zero(d + 30);

	for (i = 0; i < 30; i++)
		for (mask = 0x80; mask != 0; mask >>= 1) {
			point_double(d, d);
			if ((a[i] & mask) != 0)
				point_add(d, d, b);
		}
}